

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

EVaction INT_EVassoc_terminal_action
                   (CManager_conflict cm,EVstone stone_num,FMStructDescList format_list,
                   EVSimpleHandlerFunc handler,void *client_data)

{
  int iVar1;
  CManager_conflict cm_00;
  _proto_action *p_Var2;
  CMincoming_format_list p_Var3;
  CMFormat p_Var4;
  FMFormat p_Var5;
  EVSimpleHandlerFunc in_RCX;
  stone_type in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  void *in_R8;
  int proto_action_num;
  CManager unaff_retaddr;
  stone_type stone;
  int action_num;
  event_path_data evp;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar6;
  FILE *out;
  undefined4 in_stack_fffffffffffffff0;
  
  out = *(FILE **)(in_RDI + 0x118);
  cm_00 = (CManager_conflict)
          stone_struct((event_path_data)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
  iVar1 = cm_00->reg_user_format_count;
  p_Var2 = (_proto_action *)INT_CMrealloc(cm_00,CONCAT44(iVar1,in_stack_ffffffffffffffb8));
  cm_00->reg_user_formats = (CMFormat *)p_Var2;
  memset((_proto_action *)cm_00->reg_user_formats + iVar1,0,0x60);
  ((_proto_action *)cm_00->reg_user_formats)[iVar1].input_format_requirements =
       (FMStructDescList)in_RDX;
  ((_proto_action *)cm_00->reg_user_formats)[iVar1].action_type = Action_Terminal;
  ((_proto_action *)cm_00->reg_user_formats)[iVar1].o.term.handler = in_RCX;
  ((_proto_action *)cm_00->reg_user_formats)[iVar1].o.term.client_data = in_R8;
  ((_proto_action *)cm_00->reg_user_formats)[iVar1].matching_reference_formats = (FMFormat *)0x0;
  uVar6 = cm_00->in_format_count;
  p_Var3 = (CMincoming_format_list)INT_CMrealloc(cm_00,CONCAT44(iVar1,in_stack_ffffffffffffffb8));
  cm_00->in_formats = p_Var3;
  memset(&cm_00->in_formats->format + (long)(int)uVar6 * 6,0,0x30);
  if (in_RDX == (stone_type)0x0) {
    ((_proto_action *)cm_00->reg_user_formats)[iVar1].data_state = Requires_Contig_Encoded;
    *(uint *)((long)&cm_00->transports + 4) = uVar6;
  }
  else {
    ((_proto_action *)cm_00->reg_user_formats)[iVar1].data_state = Requires_Decoded;
    p_Var4 = (CMFormat)INT_CMmalloc((size_t)cm_00);
    cm_00->reg_user_formats[(long)iVar1 * 0xc + 2] = p_Var4;
    p_Var5 = EVregister_format_set
                       (cm_00,(FMStructDescList)CONCAT44(iVar1,in_stack_ffffffffffffffb8));
    *((_proto_action *)cm_00->reg_user_formats)[iVar1].matching_reference_formats = p_Var5;
    ((_proto_action *)cm_00->reg_user_formats)[iVar1].matching_reference_formats[1] = (FMFormat)0x0;
  }
  *(undefined4 *)((long)&cm_00->in_formats->handler + (long)(int)uVar6 * 0x30 + 4) = 3;
  *(encode_state *)((long)&cm_00->in_formats->client_data + (long)(int)uVar6 * 0x30 + 4) =
       ((_proto_action *)cm_00->reg_user_formats)[iVar1].data_state;
  if (((_proto_action *)cm_00->reg_user_formats)[iVar1].matching_reference_formats ==
      (FMFormat *)0x0) {
    (&cm_00->in_formats->format)[(long)(int)uVar6 * 6] = (FFSTypeHandle)0x0;
  }
  else {
    (&cm_00->in_formats->format)[(long)(int)uVar6 * 6] =
         (FFSTypeHandle)
         *((_proto_action *)cm_00->reg_user_formats)[iVar1].matching_reference_formats;
  }
  *(int *)(&cm_00->in_formats->client_data + (long)(int)uVar6 * 6) = iVar1;
  cm_00->reg_user_format_count = cm_00->reg_user_format_count + 1;
  iVar1 = CMtrace_val[10];
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init(unaff_retaddr,(CMTraceType)((ulong)in_RDI >> 0x20));
  }
  if (iVar1 != 0) {
    iVar1 = (int)((ulong)cm_00 >> 0x20);
    fprintf(*(FILE **)(in_RDI + 0x120),"Adding Terminal action %d to ",(ulong)uVar6);
    fprint_stone_identifier(out,(event_path_data)CONCAT44(uVar6,in_stack_ffffffffffffffc8),iVar1);
    fprintf(*(FILE **)(in_RDI + 0x120),"\nStone dump->\n");
    fdump_stone((FILE *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  }
  return uVar6;
}

Assistant:

EVaction
INT_EVassoc_terminal_action(CManager cm, EVstone stone_num, 
			    FMStructDescList format_list, EVSimpleHandlerFunc handler,
			    void *client_data)
{
    event_path_data evp = cm->evp;
    int action_num;
    stone_type stone;
    int proto_action_num;

    stone = stone_struct(evp, stone_num);
    proto_action_num = stone->proto_action_count;
    stone->proto_actions = realloc(stone->proto_actions, 
				   (proto_action_num + 1) * 
				   sizeof(stone->proto_actions[0]));
    memset(&stone->proto_actions[proto_action_num], 0, 
	   sizeof(stone->proto_actions[0]));
    stone->proto_actions[proto_action_num].input_format_requirements =
	format_list;
    stone->proto_actions[proto_action_num].action_type = Action_Terminal;
    stone->proto_actions[proto_action_num].o.term.handler = handler;
    stone->proto_actions[proto_action_num].o.term.client_data = client_data;
    stone->proto_actions[proto_action_num].matching_reference_formats = NULL;
    action_num = stone->response_cache_count;
    stone->response_cache = realloc(stone->response_cache, (action_num + 1) * 
				   sizeof(stone->response_cache[0]));
    memset(&stone->response_cache[action_num], 0, sizeof(stone->response_cache[0]));
    if (format_list != NULL) {
	stone->proto_actions[proto_action_num].data_state = Requires_Decoded;
	stone->proto_actions[proto_action_num].matching_reference_formats = 
	    malloc(2*sizeof(FMFormat));
	stone->proto_actions[proto_action_num].matching_reference_formats[0] = 
	    EVregister_format_set(cm, format_list);
	stone->proto_actions[proto_action_num].matching_reference_formats[1] = NULL;
    } else {
	stone->proto_actions[proto_action_num].data_state = Requires_Contig_Encoded;
	stone->default_action = action_num;
    }
    stone->response_cache[action_num].action_type = Action_Terminal;
    stone->response_cache[action_num].requires_decoded =
	stone->proto_actions[proto_action_num].data_state;
    if (stone->proto_actions[proto_action_num].matching_reference_formats) {
	stone->response_cache[action_num].reference_format = 
	    stone->proto_actions[proto_action_num].matching_reference_formats[0];
    } else {
	stone->response_cache[action_num].reference_format = NULL;
    }
    stone->response_cache[action_num].proto_action_id = proto_action_num;
    stone->proto_action_count++;
    if (CMtrace_on(cm, EVerbose)) {
	fprintf(cm->CMTrace_file, "Adding Terminal action %d to ", action_num);
	fprint_stone_identifier(cm->CMTrace_file, evp, stone_num);
	fprintf(cm->CMTrace_file, "\nStone dump->\n");
	fdump_stone(cm->CMTrace_file, stone);
    }
    return action_num;
}